

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O1

int tidyDocSaveStream(TidyDocImpl *doc,StreamOut *out)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  TidyAttrSortStrategy strat;
  uint uVar12;
  Node *pNVar13;
  
  iVar1 = *(int *)((doc->config).value + 0x10);
  iVar2 = *(int *)((doc->config).value + 0x19);
  iVar3 = *(int *)((doc->config).value + 0x45);
  iVar4 = *(int *)((doc->config).value + 0x4d);
  iVar5 = *(int *)((doc->config).value + 0x1a);
  iVar6 = *(int *)((doc->config).value + 0x40);
  iVar7 = *(int *)((doc->config).value + 0x43);
  iVar8 = *(int *)((doc->config).value + 0x20);
  iVar9 = *(int *)((doc->config).value + 0x47);
  iVar10 = *(int *)((doc->config).value + 0x1f);
  iVar11 = *(int *)((doc->config).value + 0x4a);
  strat = *(TidyAttrSortStrategy *)((doc->config).value + 0x5b);
  if (*(int *)((doc->config).value + 0x5e) == 0) {
    prvTidyPPrintSpaces();
  }
  else {
    prvTidyPPrintTabs();
  }
  if (iVar11 != 0) {
    prvTidyConvertCDATANodes(doc,&doc->root);
  }
  if (iVar7 != 0) {
    prvTidyDropComments(doc,&doc->root);
  }
  if (iVar8 != 0) {
    prvTidyDropFontElements(doc,&doc->root,(Node **)0x0);
  }
  if (iVar10 != 0 || iVar9 != 0 && iVar8 != 0) {
    prvTidyDowngradeTypography(doc,&doc->root);
  }
  if (iVar10 == 0) {
    prvTidyReplacePreformattedSpaces(doc,&doc->root);
  }
  else {
    prvTidyNormalizeSpaces(doc->lexer,&doc->root);
  }
  if (strat != TidySortAttrNone) {
    prvTidySortAttributes(&doc->root,strat);
  }
  if ((iVar1 == 0) || ((doc->errors != 0 && (iVar3 == 0)))) goto LAB_00124079;
  if ((iVar4 == 1) || (doc->inputHadBOM != no && iVar4 == 2)) {
    prvTidyoutBOM(out);
  }
  doc->docOut = out;
  if ((iVar2 == 0) || (iVar5 != 0)) {
    if (iVar6 == 0) {
LAB_00124055:
      prvTidyPPrintTree(doc,0,0,&doc->root);
    }
    else {
      if (iVar6 != 1) {
        pNVar13 = prvTidyFindBody(doc);
        if ((pNVar13 == (Node *)0x0) || (pNVar13->implicit == no)) goto LAB_00124055;
      }
      prvTidyPrintBody(doc);
    }
  }
  else {
    prvTidyPPrintXMLTree(doc,0,0,&doc->root);
  }
  prvTidyPFlushLine(doc,0);
  doc->docOut = (StreamOut *)0x0;
LAB_00124079:
  prvTidyResetConfigToSnapshot(doc);
  uVar12 = 2;
  if ((doc->errors == 0) && (uVar12 = 1, doc->warnings == 0)) {
    uVar12 = (uint)(doc->accessErrors != 0);
  }
  return uVar12;
}

Assistant:

int         tidyDocSaveStream( TidyDocImpl* doc, StreamOut* out )
{
    Bool showMarkup  = cfgBool( doc, TidyShowMarkup );
    Bool forceOutput = cfgBool( doc, TidyForceOutput );
#if SUPPORT_UTF16_ENCODINGS
    Bool outputBOM   = ( cfgAutoBool(doc, TidyOutputBOM) == TidyYesState );
    Bool smartBOM    = ( cfgAutoBool(doc, TidyOutputBOM) == TidyAutoState );
#endif
    Bool xmlOut      = cfgBool( doc, TidyXmlOut );
    Bool xhtmlOut    = cfgBool( doc, TidyXhtmlOut );
    TidyTriState bodyOnly    = cfgAutoBool( doc, TidyBodyOnly );

    Bool dropComments = cfgBool(doc, TidyHideComments);
    Bool makeClean    = cfgBool(doc, TidyMakeClean);
    Bool asciiChars   = cfgBool(doc, TidyAsciiChars);
    Bool makeBare     = cfgBool(doc, TidyMakeBare);
    Bool escapeCDATA  = cfgBool(doc, TidyEscapeCdata);
    Bool ppWithTabs   = cfgBool(doc, TidyPPrintTabs);
    TidyAttrSortStrategy sortAttrStrat = cfg(doc, TidySortAttributes);

    if (ppWithTabs)
        TY_(PPrintTabs)();
    else
        TY_(PPrintSpaces)();

    if (escapeCDATA)
        TY_(ConvertCDATANodes)(doc, &doc->root);

    if (dropComments)
        TY_(DropComments)(doc, &doc->root);

    if (makeClean)
    {
        /* noop */
        TY_(DropFontElements)(doc, &doc->root, NULL);
    }

    if ((makeClean && asciiChars) || makeBare)
        TY_(DowngradeTypography)(doc, &doc->root);

    if (makeBare)
        /* Note: no longer replaces &nbsp; in */
        /* attribute values / non-text tokens */
        TY_(NormalizeSpaces)(doc->lexer, &doc->root);
    else
        TY_(ReplacePreformattedSpaces)(doc, &doc->root);

    if ( sortAttrStrat != TidySortAttrNone )
        TY_(SortAttributes)(&doc->root, sortAttrStrat);

    if ( showMarkup && (doc->errors == 0 || forceOutput) )
    {
#if SUPPORT_UTF16_ENCODINGS
        /* Output a Byte Order Mark if required */
        if ( outputBOM || (doc->inputHadBOM && smartBOM) )
            TY_(outBOM)( out );
#endif

        /* No longer necessary. No DOCTYPE == HTML 3.2,
        ** which gives you only the basic character entities,
        ** which are safe in any browser.
        ** if ( !TY_(FindDocType)(doc) )
        **    TY_(SetOptionBool)( doc, TidyNumEntities, yes );
        */

        doc->docOut = out;
        if ( xmlOut && !xhtmlOut )
            TY_(PPrintXMLTree)( doc, NORMAL, 0, &doc->root );
        else if ( showBodyOnly( doc, bodyOnly ) )
            TY_(PrintBody)( doc );
        else
            TY_(PPrintTree)( doc, NORMAL, 0, &doc->root );

        TY_(PFlushLine)( doc, 0 );
        doc->docOut = NULL;
    }

    TY_(ResetConfigToSnapshot)( doc );
    return tidyDocStatus( doc );
}